

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
Descriptor_Parse_Pubkey_Uncompress_Test::~Descriptor_Parse_Pubkey_Uncompress_Test
          (Descriptor_Parse_Pubkey_Uncompress_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Descriptor, Parse_Pubkey_Uncompress) {
  std::string pubkey_hex = "04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77";
  std::string descriptor1 = "pkh(04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77)";
  std::string descriptor2 = "wpkh(04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  Pubkey pubkey;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }

  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "OP_DUP OP_HASH160 06399b0a8229214e0614afa119531b46e1d1f29b OP_EQUALVERIFY OP_CHECKSIG");
  EXPECT_STREQ(pubkey.GetHex().c_str(),
      pubkey_hex.c_str());
  EXPECT_FALSE(pubkey.IsCompress());

  try {
    desc = Descriptor::Parse(descriptor2);
    EXPECT_TRUE(false);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Failed to unsing uncompressed pubkey.", except.what());
  }
}